

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O0

void __thiscall Ym2612_Impl::run(Ym2612_Impl *this,int pair_count,sample_t_conflict1 *out)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  sample_t_conflict1 *in_RDX;
  int in_ESI;
  long in_RDI;
  int i_1;
  int ksr;
  int finc;
  slot_t *sl;
  int i;
  int i2;
  channel_t *ch;
  int chi;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  uint local_2c;
  int local_1c;
  
  if (0 < in_ESI) {
    if ((*(uint *)(in_RDI + 0x20) & 3) != 0) {
      run_timer((Ym2612_Impl *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc);
    }
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      lVar2 = in_RDI + 0x28 + (long)local_1c * 0x2a0;
      if (*(int *)(lVar2 + 0xac) == -1) {
        local_2c = 0;
        if ((local_1c == 2) && ((*(uint *)(in_RDI + 0x20) & 0x40) != 0)) {
          local_2c = 2;
        }
        for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
          plVar3 = (long *)(lVar2 + 0x58 + (long)local_30 * 0x90);
          iVar1 = *(int *)(lVar2 + 0x48 + (long)(int)local_2c * 4) >> ((byte)(int)plVar3[3] & 0x1f);
          *(uint *)((long)plVar3 + 0x54) =
               ((*(uint *)(in_RDI + 0x25064 +
                          (long)*(int *)(lVar2 + 0x28 + (long)(int)local_2c * 4) * 4) >>
                (7U - (char)*(undefined4 *)(lVar2 + 0x38 + (long)(int)local_2c * 4) & 0x1f)) +
               *(int *)(*plVar3 + (long)*(int *)(lVar2 + 0x48 + (long)(int)local_2c * 4) * 4)) *
               (int)plVar3[1];
          if (*(int *)((long)plVar3 + 0x1c) != iVar1) {
            *(int *)((long)plVar3 + 0x1c) = iVar1;
            *(undefined4 *)(plVar3 + 0xd) = *(undefined4 *)(plVar3[6] + (long)iVar1 * 4);
            *(undefined4 *)((long)plVar3 + 0x6c) = *(undefined4 *)(plVar3[7] + (long)iVar1 * 4);
            *(undefined4 *)(plVar3 + 0xe) = *(undefined4 *)(plVar3[8] + (long)iVar1 * 4);
            *(undefined4 *)((long)plVar3 + 0x74) = *(undefined4 *)(plVar3[9] + (long)iVar1 * 4);
            if ((int)plVar3[0xb] == 0) {
              *(int *)(plVar3 + 0xc) = (int)plVar3[0xd];
            }
            else if ((int)plVar3[0xb] == 1) {
              *(undefined4 *)(plVar3 + 0xc) = *(undefined4 *)((long)plVar3 + 0x6c);
            }
            else if (*(int *)((long)plVar3 + 0x5c) < 0x20000000) {
              if ((int)plVar3[0xb] == 2) {
                *(int *)(plVar3 + 0xc) = (int)plVar3[0xe];
              }
              else if ((int)plVar3[0xb] == 3) {
                *(undefined4 *)(plVar3 + 0xc) = *(undefined4 *)((long)plVar3 + 0x74);
              }
            }
          }
          if (local_2c != 0) {
            local_2c = local_2c ^ 2 ^ (int)local_2c >> 1;
          }
        }
      }
    }
    for (iVar1 = 0; iVar1 < 6; iVar1 = iVar1 + 1) {
      if (((*(uint *)(in_RDI + 0x17e8) & 1 << ((byte)iVar1 & 0x1f)) == 0) &&
         ((iVar1 != 5 || (*(int *)(in_RDI + 0x24) == 0)))) {
        (*UPDATE_CHAN[*(int *)(in_RDI + (long)iVar1 * 0x2a0 + 0x40)])
                  ((tables_t *)(in_RDI + 0x17ec),(channel_t *)(in_RDI + 0x28 + (long)iVar1 * 0x2a0),
                   in_RDX,in_ESI);
      }
    }
    *(int *)(in_RDI + 0x37ec) = *(int *)(in_RDI + 0x37f0) * in_ESI + *(int *)(in_RDI + 0x37ec);
  }
  return;
}

Assistant:

void Ym2612_Impl::run( int pair_count, Ym2612_Emu::sample_t* out )
{
	if ( pair_count <= 0 )
		return;
	
	if ( YM2612.Mode & 3 )
		run_timer( pair_count );
	
	// Mise �Ejour des pas des compteurs-frequences s'ils ont ete modifies
	
	for ( int chi = 0; chi < channel_count; chi++ )
	{
		channel_t& ch = YM2612.CHANNEL [chi];
		if ( ch.SLOT [0].Finc != -1 )
			continue;
		
		int i2 = 0;
		if ( chi == 2 && (YM2612.Mode & 0x40) )
			i2 = 2;
		
		for ( int i = 0; i < 4; i++ )
		{
			// static int seq [4] = { 2, 1, 3, 0 };
			// if ( i2 ) i2 = seq [i];
			
			slot_t& sl = ch.SLOT [i];
			int finc = g.FINC_TAB [ch.FNUM [i2]] >> (7 - ch.FOCT [i2]);
			int ksr = ch.KC [i2] >> sl.KSR_S;   // keycode attenuation
			sl.Finc = (finc + sl.DT [ch.KC [i2]]) * sl.MUL;
			if (sl.KSR != ksr)          // si le KSR a change alors
			{                       // les differents taux pour l'enveloppe sont mis �Ejour
				sl.KSR = ksr;

				sl.EincA = sl.AR [ksr];
				sl.EincD = sl.DR [ksr];
				sl.EincS = sl.SR [ksr];
				sl.EincR = sl.RR [ksr];

				if (sl.Ecurp == ATTACK)
				{
					sl.Einc = sl.EincA;
				}
				else if (sl.Ecurp == DECAY)
				{
					sl.Einc = sl.EincD;
				}
				else if (sl.Ecnt < ENV_END)
				{
					if (sl.Ecurp == SUBSTAIN)
						sl.Einc = sl.EincS;
					else if (sl.Ecurp == RELEASE)
						sl.Einc = sl.EincR;
				}
			}
			
			if ( i2 )
				i2 = (i2 ^ 2) ^ (i2 >> 1);
		}
	}
	
	for ( int i = 0; i < channel_count; i++ )
	{
		if ( !(mute_mask & (1 << i)) && (i != 5 || !YM2612.DAC) )
			UPDATE_CHAN [YM2612.CHANNEL [i].ALGO]( g, YM2612.CHANNEL [i], out, pair_count );
	}
	
	g.LFOcnt += g.LFOinc * pair_count;
}